

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithchk.c
# Opt level: O3

int main(void)

{
  FILE *__s;
  int i;
  uint uVar1;
  double dVar2;
  double dVar3;
  
  __s = _stdout;
  fprintf(_stdout,"#define %s\n#define Arith_Kind_ASL %d\n","IEEE_8087",1);
  fwrite("#define Long int\n#define Intcast (int)(long)\n",0x2d,1,__s);
  fwrite("#define Double_Align\n",0x15,1,__s);
  fwrite("#define X64_bit_pointers\n",0x19,1,__s);
  dVar3 = 0.1;
  dVar2 = 1.0;
  for (uVar1 = 0x9b; ((uVar1 & 1) == 0 || (dVar2 = dVar2 * dVar3, uVar1 != 1)); uVar1 = uVar1 >> 1)
  {
    dVar3 = dVar3 * dVar3;
  }
  if ((dVar2 * dVar2 == 0.0) && (!NAN(dVar2 * dVar2))) {
    fwrite("#define Sudden_Underflow\n",0x19,1,__s);
  }
  return 0;
}

Assistant:

int
main()
{
	Akind *a = 0;
	int Ldef = 0;
	FILE *f;

#ifdef WRITE_ARITH_H	/* for Symantec's buggy "make" */
	f = fopen("arith.h", "w");
	if (!f) {
		printf("Cannot open arith.h\n");
		return 1;
		}
#else
	f = stdout;
#endif

	if (sizeof(double) == 2*sizeof(long))
		a = Lcheck();
	else if (sizeof(double) == 2*sizeof(int)) {
		Ldef = 1;
		a = icheck();
		}
	else if (sizeof(double) == sizeof(long))
		a = ccheck();
	if (a) {
		fprintf(f, "#define %s\n#define Arith_Kind_ASL %d\n",
			a->name, a->kind);
		if (Ldef)
			fprintf(f, "#define Long int\n#define Intcast (int)(long)\n");
		if (dalign)
			fprintf(f, "#define Double_Align\n");
		if (sizeof(char*) == 8)
			fprintf(f, "#define X64_bit_pointers\n");
#ifndef NO_LONG_LONG
		if (sizeof(long long) < 8)
#endif
			fprintf(f, "#define NO_LONG_LONG\n");
		if (a->kind <= 2 && fzcheck())
			fprintf(f, "#define Sudden_Underflow\n");
		return 0;
		}
	fprintf(f, "/* Unknown arithmetic */\n");
	return 1;
	}